

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcd.c
# Opt level: O2

OPJ_BOOL opj_tcd_encode_tile(opj_tcd_t *p_tcd,OPJ_UINT32 p_tile_no,OPJ_BYTE *p_dest,
                            OPJ_UINT32 *p_data_written,OPJ_UINT32 p_max_length,
                            opj_codestream_info_t *p_cstr_info,opj_tcd_marker_info_t *p_marker_info,
                            opj_event_mgr_t *p_manager)

{
  uint uVar1;
  uint uVar2;
  OPJ_UINT32 OVar3;
  OPJ_UINT32 OVar4;
  OPJ_UINT32 OVar5;
  int iVar6;
  uint uVar7;
  J2K_QUALITY_LAYER_ALLOCATION_STRATEGY JVar8;
  opj_tccp_t *poVar9;
  opj_tcd_resolution_t *poVar10;
  opj_tile_info_t *poVar11;
  opj_tcd_tile_t *poVar12;
  OPJ_INT32 *pOVar13;
  opj_tcd_precinct_t *poVar14;
  opj_tcd_cblk_enc_t *poVar15;
  opj_tcd_pass_t *poVar16;
  double dVar17;
  double dVar18;
  double thresh;
  OPJ_FLOAT64 OVar19;
  bool bVar20;
  bool bVar21;
  OPJ_BOOL OVar22;
  int iVar23;
  opj_t2_t *poVar24;
  opj_packet_info_t *poVar25;
  opj_tcp_t *poVar26;
  OPJ_BYTE **pData;
  OPJ_FLOAT64 *mct_norms;
  ulong uVar27;
  double *pdVar28;
  ulong uVar29;
  ulong uVar30;
  OPJ_INT32 (*paOVar31) [3];
  OPJ_UINT32 OVar32;
  OPJ_SIZE_T OVar33;
  opj_tcd_tilecomp_t *poVar34;
  ulong uVar35;
  opj_tccp_t *poVar36;
  long lVar37;
  ulong uVar38;
  uint uVar39;
  undefined4 in_register_00000084;
  opj_tcd_tilecomp_t *poVar40;
  OPJ_INT32 (*paOVar41) [3];
  long lVar42;
  int iVar43;
  long lVar44;
  int *piVar45;
  opj_tcd_tile_t *l_tile;
  OPJ_SIZE_T OVar46;
  opj_cp_t *p_cp;
  int iVar47;
  OPJ_INT32 **ppOVar48;
  OPJ_UINT32 layno;
  OPJ_UINT32 *pOVar49;
  float fVar50;
  OPJ_FLOAT32 OVar51;
  undefined4 uVar52;
  undefined1 auVar53 [16];
  double dVar54;
  double dVar55;
  double dVar56;
  double dVar57;
  double dVar58;
  double dVar59;
  undefined4 local_598;
  undefined4 uStack_594;
  OPJ_UINT32 local_578;
  double local_558;
  OPJ_UINT32 local_534;
  opj_cp_t *cp;
  double local_528;
  undefined8 uStack_520;
  long local_518;
  OPJ_BYTE *local_510;
  undefined1 local_508 [16];
  OPJ_INT32 OStack_4f4;
  OPJ_UINT32 *local_4f0;
  OPJ_INT32 matrice [10] [10] [3];
  
  local_518 = CONCAT44(in_register_00000084,p_max_length);
  local_510 = p_dest;
  local_4f0 = p_data_written;
  if (p_tcd->cur_tp_num == 0) {
    p_tcd->tcd_tileno = p_tile_no;
    poVar26 = p_tcd->cp->tcps + p_tile_no;
    p_tcd->tcp = poVar26;
    if (p_cstr_info != (opj_codestream_info_t *)0x0) {
      poVar34 = p_tcd->tcd_image->tiles->comps;
      poVar9 = poVar26->tccps;
      lVar37 = 4;
      uVar39 = 0;
      for (uVar35 = 0; uVar35 < poVar34->numresolutions; uVar35 = uVar35 + 1) {
        poVar10 = poVar34->resolutions;
        poVar11 = p_cstr_info->tile;
        poVar11[p_tile_no].pw[uVar35] = *(int *)((long)poVar10->bands + lVar37 * 4 + -0x20);
        iVar23 = *(int *)((long)poVar10->bands + lVar37 * 4 + -0x1c);
        poVar11[p_tile_no].ph[uVar35] = iVar23;
        uVar39 = uVar39 + iVar23 * *(int *)((long)poVar10->bands + lVar37 * 4 + -0x20);
        poVar11[p_tile_no].pdx[uVar35] = poVar9->prcw[uVar35];
        poVar11[p_tile_no].pdy[uVar35] = poVar9->prch[uVar35];
        lVar37 = lVar37 + 0x30;
      }
      poVar25 = (opj_packet_info_t *)
                opj_calloc((ulong)uVar39 * (long)p_cstr_info->numcomps *
                           (long)p_cstr_info->numlayers,0x20);
      p_cstr_info->tile[p_tile_no].packet = poVar25;
      if (poVar25 == (opj_packet_info_t *)0x0) {
        return 0;
      }
      poVar26 = p_tcd->tcp;
    }
    poVar12 = p_tcd->tcd_image->tiles;
    poVar34 = poVar12->comps;
    poVar9 = poVar26->tccps;
    poVar36 = poVar9;
    poVar40 = poVar34;
    for (uVar39 = 0; uVar39 < poVar12->numcomps; uVar39 = uVar39 + 1) {
      pOVar13 = poVar40->data;
      lVar37 = (long)(poVar40->y1 - poVar40->y0) * (long)(poVar40->x1 - poVar40->x0);
      if (poVar36->qmfbid == 1) {
        for (lVar42 = 0; lVar37 - lVar42 != 0; lVar42 = lVar42 + 1) {
          pOVar13[lVar42] = pOVar13[lVar42] - poVar36->m_dc_level_shift;
        }
      }
      else {
        for (lVar42 = 0; lVar37 - lVar42 != 0; lVar42 = lVar42 + 1) {
          pOVar13[lVar42] = (OPJ_INT32)(float)(pOVar13[lVar42] - poVar36->m_dc_level_shift);
        }
      }
      poVar36 = poVar36 + 1;
      poVar40 = poVar40 + 1;
    }
    if (poVar26->mct != 0) {
      OVar33 = ((long)poVar34->y1 - (long)poVar34->y0) * ((long)poVar34->x1 - (long)poVar34->x0);
      if (poVar26->mct == 2) {
        if (poVar26->m_mct_coding_matrix != (OPJ_FLOAT32 *)0x0) {
          pData = (OPJ_BYTE **)opj_malloc((ulong)poVar12->numcomps << 3);
          if (pData == (OPJ_BYTE **)0x0) {
            return 0;
          }
          uVar39 = poVar12->numcomps;
          ppOVar48 = &poVar34->data;
          for (uVar35 = 0; uVar39 != uVar35; uVar35 = uVar35 + 1) {
            pData[uVar35] = (OPJ_BYTE *)*ppOVar48;
            ppOVar48 = ppOVar48 + 0xe;
          }
          OVar22 = opj_mct_encode_custom
                             ((OPJ_BYTE *)p_tcd->tcp->m_mct_coding_matrix,OVar33,pData,uVar39,
                              p_tcd->image->comps->sgnd);
          opj_free(pData);
          if (OVar22 == 0) {
            return 0;
          }
        }
      }
      else if (poVar9->qmfbid == 0) {
        opj_mct_encode_real((OPJ_FLOAT32 *)poVar34->data,(OPJ_FLOAT32 *)poVar34[1].data,
                            (OPJ_FLOAT32 *)poVar34[2].data,OVar33);
      }
      else {
        opj_mct_encode(poVar34->data,poVar34[1].data,poVar34[2].data,OVar33);
      }
    }
    poVar12 = p_tcd->tcd_image->tiles;
    poVar34 = poVar12->comps;
    pOVar49 = &p_tcd->tcp->tccps->qmfbid;
    for (uVar39 = 0; uVar39 < poVar12->numcomps; uVar39 = uVar39 + 1) {
      if (*pOVar49 == 0) {
        iVar23 = opj_dwt_encode_real(p_tcd,poVar34);
LAB_0013d12a:
        if (iVar23 == 0) {
          return 0;
        }
      }
      else if (*pOVar49 == 1) {
        iVar23 = opj_dwt_encode(p_tcd,poVar34);
        goto LAB_0013d12a;
      }
      poVar34 = poVar34 + 1;
      pOVar49 = pOVar49 + 0x10e;
    }
    poVar26 = p_tcd->tcp;
    if (poVar26->mct == 1) {
      OVar32 = 3;
      if (poVar26->tccps->qmfbid == 0) {
        mct_norms = opj_mct_get_mct_norms_real();
      }
      else {
        mct_norms = opj_mct_get_mct_norms();
      }
    }
    else {
      OVar32 = p_tcd->image->numcomps;
      mct_norms = poVar26->mct_norms;
    }
    OVar22 = opj_t1_encode_cblks(p_tcd,p_tcd->tcd_image->tiles,poVar26,mct_norms,OVar32);
    if (OVar22 == 0) {
      return 0;
    }
    cp = p_tcd->cp;
    local_534 = 0;
    if (p_cstr_info != (opj_codestream_info_t *)0x0) {
      p_cstr_info->index_write = 0;
    }
    if ((cp->m_specific_param).m_enc.m_quality_layer_alloc_strategy < FIXED_LAYER) {
      poVar26 = p_tcd->tcp;
      poVar12 = p_tcd->tcd_image->tiles;
      poVar12->numpix = 0;
      uVar39 = poVar12->numcomps;
      dVar54 = 1.79769313486232e+308;
      local_508 = ZEXT816(0);
      OVar33 = 0;
      local_528 = 0.0;
      uStack_520 = 0;
      for (uVar35 = 0; uVar35 != uVar39; uVar35 = uVar35 + 1) {
        poVar34 = poVar12->comps;
        poVar34[uVar35].numpix = 0;
        uVar1 = poVar34[uVar35].numresolutions;
        OVar46 = 0;
        for (uVar30 = 0; uVar30 != uVar1; uVar30 = uVar30 + 1) {
          poVar10 = poVar34[uVar35].resolutions;
          uVar2 = poVar10[uVar30].numbands;
          for (uVar27 = 0; uVar27 != uVar2; uVar27 = uVar27 + 1) {
            OVar22 = opj_tcd_is_band_empty(poVar10[uVar30].bands + uVar27);
            if (OVar22 == 0) {
              OVar32 = poVar10[uVar30].ph;
              OVar3 = poVar10[uVar30].pw;
              for (uVar29 = 0; uVar29 != OVar32 * OVar3; uVar29 = uVar29 + 1) {
                poVar14 = poVar10[uVar30].bands[uVar27].precincts;
                OVar4 = poVar14[uVar29].ch;
                OVar5 = poVar14[uVar29].cw;
                for (uVar38 = 0; uVar38 != OVar4 * OVar5; uVar38 = uVar38 + 1) {
                  poVar15 = poVar14[uVar29].cblks.enc;
                  for (lVar37 = 0; (ulong)poVar15[uVar38].totalpasses * 0x18 - lVar37 != 0;
                      lVar37 = lVar37 + 0x18) {
                    poVar16 = poVar15[uVar38].passes;
                    iVar23 = *(int *)((long)&poVar16->rate + lVar37);
                    if (lVar37 == 0) {
                      dVar17 = (double)poVar16->distortiondec;
                    }
                    else {
                      iVar23 = iVar23 - *(int *)((long)&poVar16[-1].rate + lVar37);
                      dVar17 = *(double *)((long)&poVar16->distortiondec + lVar37) -
                               *(double *)((long)poVar16 + lVar37 + -0x10);
                    }
                    if (iVar23 != 0) {
                      dVar17 = dVar17 / (double)iVar23;
                      dVar18 = dVar17;
                      if (dVar54 <= dVar17) {
                        dVar18 = dVar54;
                      }
                      dVar54 = dVar18;
                      if (dVar17 <= local_528) {
                        dVar17 = local_528;
                      }
                      local_528 = dVar17;
                      uStack_520 = 0;
                    }
                  }
                  lVar37 = (long)((poVar15[uVar38].y1 - poVar15[uVar38].y0) *
                                 (poVar15[uVar38].x1 - poVar15[uVar38].x0));
                  OVar33 = OVar33 + lVar37;
                  poVar12->numpix = OVar33;
                  OVar46 = OVar46 + lVar37;
                  poVar34[uVar35].numpix = OVar46;
                }
              }
            }
          }
        }
        dVar17 = (double)(1 << ((byte)p_tcd->image->comps[uVar35].prec & 0x1f)) + -1.0;
        auVar53._8_4_ = (int)(OVar46 >> 0x20);
        auVar53._0_8_ = OVar46;
        auVar53._12_4_ = 0x45300000;
        uVar52 = local_508._12_4_;
        local_508._8_4_ = local_508._8_4_;
        local_508._0_8_ =
             local_508._0_8_ +
             ((auVar53._8_8_ - 1.9342813113834067e+25) +
             ((double)CONCAT44(0x43300000,(int)OVar46) - 4503599627370496.0)) * dVar17 * dVar17;
        local_508._12_4_ = uVar52;
      }
      if (p_cstr_info != (opj_codestream_info_t *)0x0) {
        poVar11 = p_cstr_info->tile;
        uVar39 = p_tcd->tcd_tileno;
        poVar11[uVar39].numpix = (int)OVar33;
        poVar11[uVar39].distotile = (double)(int)(double)poVar12->distotile;
        pdVar28 = (double *)opj_malloc((ulong)poVar26->numlayers << 3);
        poVar11[uVar39].thresh = pdVar28;
        if (pdVar28 == (double *)0x0) {
          return 0;
        }
      }
      p_cp = cp;
      for (uVar35 = 0; uVar35 < poVar26->numlayers; uVar35 = uVar35 + 1) {
        local_578 = (OPJ_UINT32)local_518;
        if (0.0 < (float)poVar26->rates[uVar35]) {
          fVar50 = ceilf((float)poVar26->rates[uVar35]);
          lVar37 = (long)fVar50;
          if ((uint)local_518 <= (uint)(long)fVar50) {
            lVar37 = local_518;
          }
          local_578 = (OPJ_UINT32)lVar37;
        }
        dVar17 = (double)poVar12->distotile;
        dVar18 = pow(10.0,(double)((float)poVar26->distoratio[uVar35] / 10.0));
        JVar8 = (p_cp->m_specific_param).m_enc.m_quality_layer_alloc_strategy;
        OVar32 = (OPJ_UINT32)uVar35;
        if (JVar8 == FIXED_DISTORTION_RATIO) {
          OVar51 = poVar26->distoratio[uVar35];
LAB_0013d856:
          local_598 = 0;
          uStack_594 = 0xbff00000;
          if (0.0 < (float)OVar51) {
            poVar24 = opj_t2_create(p_tcd->image,p_cp);
            if (poVar24 == (opj_t2_t *)0x0) {
              return 0;
            }
            dVar18 = (double)local_508._0_8_ / dVar18;
            iVar23 = 0;
            local_558 = 0.0;
            bVar20 = false;
            dVar55 = 0.0;
            dVar56 = dVar54;
            dVar58 = local_528;
            while ((iVar23 != 0x80 &&
                   (thresh = (dVar56 + dVar58) * 0.5, dVar55 * 5e-06 < ABS(thresh - dVar55)))) {
              OVar22 = opj_tcd_makelayer(p_tcd,OVar32,(OPJ_FLOAT64)thresh,0);
              dVar57 = thresh;
              dVar59 = dVar58;
              if ((p_cp->m_specific_param).m_enc.m_quality_layer_alloc_strategy ==
                  FIXED_DISTORTION_RATIO) {
                bVar21 = bVar20;
                if ((ushort)((short)*(undefined4 *)p_cp - 3U) < 4 ||
                    (ushort)((short)*(undefined4 *)p_cp - 0x400U) < 0x59c) {
                  OVar22 = opj_t2_encode_packets
                                     (poVar24,p_tcd->tcd_tileno,poVar12,OVar32 + 1,local_510,
                                      &local_534,local_578,p_cstr_info,(opj_tcd_marker_info_t *)0x0,
                                      p_tcd->cur_tp_num,p_tcd->tp_pos,p_tcd->cur_pino,THRESH_CALC,
                                      p_manager);
                  if (OVar22 == 0) goto LAB_0013db43;
                  if (uVar35 == 0) {
                    OVar19 = poVar12->distolayer[0];
                  }
                  else {
                    OVar19 = (OPJ_FLOAT64)
                             (*(double *)(matrice[0][0] + (ulong)(OVar32 - 1) * 2) +
                             (double)poVar12->distolayer[uVar35]);
                  }
                }
                else if (uVar35 == 0) {
                  OVar19 = poVar12->distolayer[0];
                }
                else {
                  OVar19 = (OPJ_FLOAT64)
                           (*(double *)(matrice[0][0] + (ulong)(OVar32 - 1) * 2) +
                           (double)poVar12->distolayer[uVar35]);
                }
                dVar55 = local_558;
                dVar57 = dVar56;
                dVar59 = thresh;
                local_558 = thresh;
                dVar56 = thresh;
                if (dVar17 - dVar18 <= (double)OVar19) goto LAB_0013db32;
              }
              else {
                bVar21 = false;
                if (bVar20 || (iVar23 == 0 || OVar22 == 0)) {
                  dVar55 = thresh;
                  dVar58 = thresh;
                  if (iVar23 != 0 && OVar22 != 0) {
                    bVar20 = true;
                  }
                  else {
                    OVar22 = opj_t2_encode_packets
                                       (poVar24,p_tcd->tcd_tileno,poVar12,OVar32 + 1,local_510,
                                        &local_534,local_578,p_cstr_info,
                                        (opj_tcd_marker_info_t *)0x0,p_tcd->cur_tp_num,p_tcd->tp_pos
                                        ,p_tcd->cur_pino,THRESH_CALC,p_manager);
                    bVar20 = true;
                    bVar21 = false;
                    if (OVar22 == 0) goto LAB_0013db43;
                  }
LAB_0013db32:
                  dVar57 = dVar56;
                  dVar59 = dVar58;
                  local_558 = dVar55;
                  bVar21 = bVar20;
                }
              }
LAB_0013db43:
              bVar20 = bVar21;
              iVar23 = iVar23 + 1;
              p_cp = cp;
              dVar55 = thresh;
              dVar56 = dVar57;
              dVar58 = dVar59;
            }
            uVar30 = ~-(ulong)(local_558 == 0.0) & (ulong)local_558 |
                     (ulong)dVar55 & -(ulong)(local_558 == 0.0);
            opj_t2_destroy(poVar24);
            local_598 = (undefined4)uVar30;
            uStack_594 = (undefined4)(uVar30 >> 0x20);
          }
        }
        else {
          local_598 = 0;
          uStack_594 = 0xbff00000;
          if (JVar8 == RATE_DISTORTION_RATIO) {
            OVar51 = poVar26->rates[uVar35];
            goto LAB_0013d856;
          }
        }
        if (p_cstr_info != (opj_codestream_info_t *)0x0) {
          p_cstr_info->tile[p_tcd->tcd_tileno].thresh[uVar35] =
               (double)CONCAT44(uStack_594,local_598);
        }
        opj_tcd_makelayer(p_tcd,OVar32,(OPJ_FLOAT64)CONCAT44(uStack_594,local_598),1);
        if (uVar35 == 0) {
          OVar19 = poVar12->distolayer[0];
        }
        else {
          OVar19 = (OPJ_FLOAT64)
                   (*(double *)(matrice[-1][9] + uVar35 * 2 + 1) +
                   (double)poVar12->distolayer[uVar35]);
        }
        *(OPJ_FLOAT64 *)(matrice[0][0] + uVar35 * 2) = OVar19;
      }
    }
    else {
      local_508._4_4_ = 0;
      local_508._0_4_ = p_tcd->tcp->numlayers;
      for (lVar37 = 0; lVar37 != local_508._0_8_; lVar37 = lVar37 + 1) {
        poVar12 = p_tcd->tcd_image->tiles;
        uVar39 = poVar12->numcomps;
        for (uVar35 = 0; uVar35 != uVar39; uVar35 = uVar35 + 1) {
          poVar34 = poVar12->comps;
          uVar1 = poVar34[uVar35].numresolutions;
          iVar23 = 0;
          paOVar31 = matrice[0];
          for (lVar42 = 0; lVar42 != local_508._0_8_; lVar42 = lVar42 + 1) {
            paOVar41 = paOVar31;
            iVar43 = iVar23;
            for (uVar30 = 0; uVar30 != uVar1; uVar30 = uVar30 + 1) {
              pOVar13 = (cp->m_specific_param).m_enc.m_matrice;
              uVar2 = p_tcd->image->comps[uVar35].prec;
              for (lVar44 = 0; lVar44 != 3; lVar44 = lVar44 + 1) {
                (*(OPJ_INT32 (*) [3])*paOVar41)[lVar44] =
                     (int)((float)pOVar13[(uint)(iVar43 + (int)lVar44)] *
                          (float)((double)uVar2 * 0.0625));
              }
              paOVar41 = paOVar41 + 1;
              iVar43 = iVar43 + 3;
            }
            paOVar31 = paOVar31 + 10;
            iVar23 = iVar23 + uVar1 * 3;
          }
          for (uVar30 = 0; uVar30 != uVar1; uVar30 = uVar30 + 1) {
            poVar10 = poVar34[uVar35].resolutions;
            uVar2 = poVar10[uVar30].numbands;
            dVar54 = 0.0;
            while (dVar54 != (double)(ulong)uVar2) {
              local_528 = dVar54;
              OVar22 = opj_tcd_is_band_empty(poVar10[uVar30].bands + (long)dVar54);
              if (OVar22 == 0) {
                OVar32 = poVar10[uVar30].ph;
                OVar3 = poVar10[uVar30].pw;
                for (uVar27 = 0; uVar27 != OVar32 * OVar3; uVar27 = uVar27 + 1) {
                  poVar14 = poVar10[uVar30].bands[(long)dVar54].precincts;
                  OVar4 = poVar14[uVar27].ch;
                  OVar5 = poVar14[uVar27].cw;
                  for (lVar42 = 0; (ulong)(OVar4 * OVar5) << 6 != lVar42; lVar42 = lVar42 + 0x40) {
                    poVar15 = poVar14[uVar27].cblks.enc;
                    iVar43 = p_tcd->image->comps[uVar35].prec -
                             *(int *)((long)&poVar15->numbps + lVar42);
                    iVar23 = matrice[lVar37][uVar30][(long)local_528];
                    if (lVar37 == 0) {
                      iVar47 = iVar23 - iVar43;
                      if (iVar47 == 0 || iVar23 < iVar43) {
                        iVar47 = 0;
                      }
                      *(undefined4 *)((long)&poVar15->numpassesinlayers + lVar42) = 0;
                    }
                    else {
                      iVar6 = matrice[(int)lVar37 - 1][uVar30][(long)local_528];
                      iVar47 = iVar23 - iVar6;
                      if ((iVar6 - iVar43 == 0 || iVar6 < iVar43) &&
                         (iVar47 = (iVar6 - iVar43) + iVar47, iVar47 < 1)) {
                        iVar47 = 0;
                      }
                    }
                    piVar45 = (int *)(lVar37 * 0x18 + *(long *)((long)&poVar15->layers + lVar42));
                    iVar23 = *(int *)((long)&poVar15->numpassesinlayers + lVar42);
                    if (iVar23 == 0) {
                      iVar43 = iVar47 * 3 + -2;
                      if (iVar47 != 0) {
                        iVar47 = iVar43;
                      }
                      *piVar45 = iVar47;
                      if (iVar47 != 0) {
                        piVar45[1] = *(int *)(*(long *)((long)&poVar15->passes + lVar42) +
                                             (ulong)(iVar47 - 1) * 0x18);
                        lVar44 = *(long *)((long)&poVar15->data + lVar42);
                        goto LAB_0013d6fe;
                      }
                    }
                    else {
                      iVar6 = iVar47 * 3;
                      *piVar45 = iVar6;
                      if (iVar47 != 0) {
                        lVar44 = *(long *)((long)&poVar15->passes + lVar42);
                        iVar43 = iVar6 + iVar23;
                        uVar7 = *(uint *)(lVar44 + (ulong)(iVar23 - 1) * 0x18);
                        piVar45[1] = *(int *)(lVar44 + (ulong)((iVar6 + iVar23) - 1) * 0x18) - uVar7
                        ;
                        lVar44 = (ulong)uVar7 + *(long *)((long)&poVar15->data + lVar42);
LAB_0013d6fe:
                        *(long *)(piVar45 + 4) = lVar44;
                        *(int *)((long)&poVar15->numpassesinlayers + lVar42) = iVar43;
                      }
                    }
                  }
                }
              }
              dVar54 = (double)((long)local_528 + 1);
            }
          }
        }
      }
    }
  }
  if (p_cstr_info != (opj_codestream_info_t *)0x0) {
    p_cstr_info->index_write = 1;
  }
  poVar24 = opj_t2_create(p_tcd->image,p_tcd->cp);
  if (poVar24 != (opj_t2_t *)0x0) {
    OVar22 = opj_t2_encode_packets
                       (poVar24,p_tcd->tcd_tileno,p_tcd->tcd_image->tiles,p_tcd->tcp->numlayers,
                        local_510,local_4f0,(OPJ_UINT32)local_518,p_cstr_info,p_marker_info,
                        p_tcd->tp_num,p_tcd->tp_pos,p_tcd->cur_pino,FINAL_PASS,p_manager);
    opj_t2_destroy(poVar24);
    if (OVar22 != 0) {
      return 1;
    }
  }
  return 0;
}

Assistant:

OPJ_BOOL opj_tcd_encode_tile(opj_tcd_t *p_tcd,
                             OPJ_UINT32 p_tile_no,
                             OPJ_BYTE *p_dest,
                             OPJ_UINT32 * p_data_written,
                             OPJ_UINT32 p_max_length,
                             opj_codestream_info_t *p_cstr_info,
                             opj_tcd_marker_info_t* p_marker_info,
                             opj_event_mgr_t *p_manager)
{

    if (p_tcd->cur_tp_num == 0) {

        p_tcd->tcd_tileno = p_tile_no;
        p_tcd->tcp = &p_tcd->cp->tcps[p_tile_no];

        /* INDEX >> "Precinct_nb_X et Precinct_nb_Y" */
        if (p_cstr_info)  {
            OPJ_UINT32 l_num_packs = 0;
            OPJ_UINT32 i;
            opj_tcd_tilecomp_t *l_tilec_idx =
                &p_tcd->tcd_image->tiles->comps[0];        /* based on component 0 */
            opj_tccp_t *l_tccp = p_tcd->tcp->tccps; /* based on component 0 */

            for (i = 0; i < l_tilec_idx->numresolutions; i++) {
                opj_tcd_resolution_t *l_res_idx = &l_tilec_idx->resolutions[i];

                p_cstr_info->tile[p_tile_no].pw[i] = (int)l_res_idx->pw;
                p_cstr_info->tile[p_tile_no].ph[i] = (int)l_res_idx->ph;

                l_num_packs += l_res_idx->pw * l_res_idx->ph;
                p_cstr_info->tile[p_tile_no].pdx[i] = (int)l_tccp->prcw[i];
                p_cstr_info->tile[p_tile_no].pdy[i] = (int)l_tccp->prch[i];
            }
            p_cstr_info->tile[p_tile_no].packet = (opj_packet_info_t*) opj_calloc((
                    OPJ_SIZE_T)p_cstr_info->numcomps * (OPJ_SIZE_T)p_cstr_info->numlayers *
                                                  l_num_packs,
                                                  sizeof(opj_packet_info_t));
            if (!p_cstr_info->tile[p_tile_no].packet) {
                /* FIXME event manager error callback */
                return OPJ_FALSE;
            }
        }
        /* << INDEX */

        /* FIXME _ProfStart(PGROUP_DC_SHIFT); */
        /*---------------TILE-------------------*/
        if (! opj_tcd_dc_level_shift_encode(p_tcd)) {
            return OPJ_FALSE;
        }
        /* FIXME _ProfStop(PGROUP_DC_SHIFT); */

        /* FIXME _ProfStart(PGROUP_MCT); */
        if (! opj_tcd_mct_encode(p_tcd)) {
            return OPJ_FALSE;
        }
        /* FIXME _ProfStop(PGROUP_MCT); */

        /* FIXME _ProfStart(PGROUP_DWT); */
        if (! opj_tcd_dwt_encode(p_tcd)) {
            return OPJ_FALSE;
        }
        /* FIXME  _ProfStop(PGROUP_DWT); */

        /* FIXME  _ProfStart(PGROUP_T1); */
        if (! opj_tcd_t1_encode(p_tcd)) {
            return OPJ_FALSE;
        }
        /* FIXME _ProfStop(PGROUP_T1); */

        /* FIXME _ProfStart(PGROUP_RATE); */
        if (! opj_tcd_rate_allocate_encode(p_tcd, p_dest, p_max_length,
                                           p_cstr_info, p_manager)) {
            return OPJ_FALSE;
        }
        /* FIXME _ProfStop(PGROUP_RATE); */

    }
    /*--------------TIER2------------------*/

    /* INDEX */
    if (p_cstr_info) {
        p_cstr_info->index_write = 1;
    }
    /* FIXME _ProfStart(PGROUP_T2); */

    if (! opj_tcd_t2_encode(p_tcd, p_dest, p_data_written, p_max_length,
                            p_cstr_info, p_marker_info, p_manager)) {
        return OPJ_FALSE;
    }
    /* FIXME _ProfStop(PGROUP_T2); */

    /*---------------CLEAN-------------------*/

    return OPJ_TRUE;
}